

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O0

float * __thiscall Vector<float>::operator[](Vector<float> *this,int i)

{
  int i_local;
  Vector<float> *this_local;
  
  return this->ptr_to_data + i;
}

Assistant:

inline const T&   Vector< T >::operator [] (int i)  const
{
#ifdef DEBUG
//    cerr << "const T&   Vector< T >::operator [] (int i)  const" << endl;
#endif

#ifdef CHECK_SIZE
    if ( ptr_to_data == 0 ) error("Vector<>::operator[], empty array");

    if ( !( (i >= 0) && (i < num_elts) ) ) error("Vector<>::operator[], index out of bound");
#endif

    return *(ptr_to_data + i);
}